

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mame_ym2612fm.c
# Opt level: O2

void ym2612_generate(void *chip,FMSAMPLE *buffer,int frames,int mix)

{
  undefined8 in_RAX;
  int iVar1;
  bool bVar2;
  FMSAMPLE bufTmp [2];
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  ym2612_pre_generate(chip);
  if (frames == 0) {
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4710));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x48b0));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4a50));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4bf0));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4d90));
    update_ssg_eg_channel((FM_SLOT *)((long)chip + 0x4f30));
  }
  iVar1 = 0;
  if (0 < frames) {
    iVar1 = frames;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    if (mix == 0) {
      ym2612_generate_one_native(chip,buffer);
    }
    else {
      ym2612_generate_one_native(chip,(FMSAMPLE *)((long)&uStack_38 + 4));
      *(uint *)buffer =
           CONCAT22((short)((uint)*(undefined4 *)buffer >> 0x10) + (short)((ulong)uStack_38 >> 0x30)
                    ,(short)*(undefined4 *)buffer + (short)((ulong)uStack_38 >> 0x20));
    }
    buffer = buffer + 2;
  }
  return;
}

Assistant:

void ym2612_generate(void *chip, FMSAMPLE *buffer, int frames, int mix)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_CH  *cch = F2612->CH;
	FMSAMPLE  *bufOut = buffer;
	int i;
#if !RSM_ENABLE
	FMSAMPLE bufTmp[2];
#endif

	ym2612_pre_generate(chip);

	if (!frames)
	{
		update_ssg_eg_channel(&cch[0].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4].SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5].SLOT[SLOT1]);
	}

	/* buffering */
	for(i=0 ; i < frames ; i++)
	{
#if RSM_ENABLE
		while(F2612->OPN.ST.framecnt >= F2612->OPN.ST.rateratio)/* Copy-Pasta from Nuked */
		{
			/* Copy-Pasta from Nuked */
			F2612->OPN.ST.prev_sample[0] = F2612->OPN.ST.cur_sample[0];
			F2612->OPN.ST.prev_sample[1] = F2612->OPN.ST.cur_sample[1];
			ym2612_generate_one_native(chip, F2612->OPN.ST.cur_sample);
			F2612->OPN.ST.framecnt -= F2612->OPN.ST.rateratio;
			/* Copy-Pasta from Nuked */
		}
		if (mix)
		{
			*bufOut++ += (FMSAMPLE)((F2612->OPN.ST.prev_sample[0] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[0] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
			*bufOut++ += (FMSAMPLE)((F2612->OPN.ST.prev_sample[1] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[1] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
		} else {
			*bufOut++ = (FMSAMPLE)((F2612->OPN.ST.prev_sample[0] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[0] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
			*bufOut++ = (FMSAMPLE)((F2612->OPN.ST.prev_sample[1] * (F2612->OPN.ST.rateratio - F2612->OPN.ST.framecnt)
								  + F2612->OPN.ST.cur_sample[1] * F2612->OPN.ST.framecnt) / F2612->OPN.ST.rateratio);
		}
		F2612->OPN.ST.framecnt += 1 << RSM_FRAC;
#else
		if (mix)
		{
			ym2612_generate_one_native(chip, bufTmp);
			bufOut[0] += bufTmp[0];
			bufOut[1] += bufTmp[1];
		}
		else
		{
			ym2612_generate_one_native(chip, bufOut);
		}
		bufOut += 2;
#endif
	}
	/* ym2612_post_generate(chip, frames); */
}